

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::Option::ignore_underscore<CLI::App>(Option *this,bool value)

{
  bool bVar1;
  pointer puVar2;
  Option *this_00;
  string *__rhs;
  OptionAlreadyAdded *this_01;
  undefined7 in_register_00000031;
  pointer puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  bVar1 = (this->super_OptionBase<CLI::Option>).ignore_underscore_;
  (this->super_OptionBase<CLI::Option>).ignore_underscore_ = value;
  if (((int)CONCAT71(in_register_00000031,value) != 0) && (bVar1 == false)) {
    puVar2 = (this->parent_->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->parent_->options_).
                  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1)
    {
      this_00 = (puVar3->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (this_00 != this) {
        __rhs = matching_name_abi_cxx11_(this_00,this);
        if (__rhs->_M_string_length != 0) {
          (this->super_OptionBase<CLI::Option>).ignore_underscore_ = false;
          this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::operator+(&bStack_48,"adding ignore underscore caused a name conflict with ",__rhs)
          ;
          OptionAlreadyAdded::OptionAlreadyAdded(this_01,&bStack_48);
          __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
      }
    }
  }
  return this;
}

Assistant:

Option *ignore_underscore(bool value = true) {

        if(!ignore_underscore_ && value) {
            ignore_underscore_ = value;
            auto *parent = static_cast<T *>(parent_);
            for(const Option_p &opt : parent->options_) {
                if(opt.get() == this) {
                    continue;
                }
                auto &omatch = opt->matching_name(*this);
                if(!omatch.empty()) {
                    ignore_underscore_ = false;
                    throw OptionAlreadyAdded("adding ignore underscore caused a name conflict with " + omatch);
                }
            }
        } else {
            ignore_underscore_ = value;
        }
        return this;
    }